

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O2

void tinfzlib(void)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  uchar *source;
  ulong uVar4;
  uchar out [1];
  undefined3 uStack_13b;
  char suffix [32];
  
  iVar2 = greatest_test_pre("zlib_empty_raw");
  if (iVar2 == 1) {
    suffix[0] = '\0';
    suffix[1] = '\0';
    suffix[2] = '\0';
    suffix[3] = '\0';
    iVar2 = tinf_zlib_uncompress("",(uint *)suffix,zlib_empty_raw_data,0xb);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar2 == 0 && suffix._0_4_ == 0) {
      greatest_info.msg = (char *)0x0;
      iVar2 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x1f7;
      greatest_info.msg = "res == TINF_OK && dlen == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00102519;
      iVar2 = -1;
    }
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("zlib_empty_fixed");
  if (iVar2 == 1) {
    suffix[0] = '\0';
    suffix[1] = '\0';
    suffix[2] = '\0';
    suffix[3] = '\0';
    iVar2 = tinf_zlib_uncompress("",(uint *)suffix,&zlib_empty_fixed_data,8);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar2 == 0 && suffix._0_4_ == 0) {
      greatest_info.msg = (char *)0x0;
      iVar2 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x207;
      greatest_info.msg = "res == TINF_OK && dlen == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00102519;
      iVar2 = -1;
    }
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("zlib_empty_dynamic");
  if (iVar2 == 1) {
    suffix[0] = '\0';
    suffix[1] = '\0';
    suffix[2] = '\0';
    suffix[3] = '\0';
    iVar2 = tinf_zlib_uncompress("",(uint *)suffix,zlib_empty_dynamic_data,0x12);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar2 == 0 && suffix._0_4_ == 0) {
      greatest_info.msg = (char *)0x0;
      iVar2 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x218;
      greatest_info.msg = "res == TINF_OK && dlen == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00102519;
      iVar2 = -1;
    }
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("zlib_onebyte_raw");
  if (iVar2 == 1) {
    _out = CONCAT31(uStack_13b,0xff);
    suffix[0] = '\x01';
    suffix[1] = '\0';
    suffix[2] = '\0';
    suffix[3] = '\0';
    iVar2 = tinf_zlib_uncompress(out,(uint *)suffix,zlib_onebyte_raw_data,0xc);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar2 == 0) && (suffix._0_4_ == 1)) && (out[0] == '\0')) {
      greatest_info.msg = (char *)0x0;
      iVar2 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x22a;
      greatest_info.msg = "res == TINF_OK && dlen == 1 && out[0] == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00102519;
      iVar2 = -1;
    }
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("zlib_onebyte_fixed");
  if (iVar2 == 1) {
    _out = CONCAT31(uStack_13b,0xff);
    suffix[0] = '\x01';
    suffix[1] = '\0';
    suffix[2] = '\0';
    suffix[3] = '\0';
    iVar2 = tinf_zlib_uncompress(out,(uint *)suffix,zlib_onebyte_fixed_data,9);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar2 == 0) && (suffix._0_4_ == 1)) && (out[0] == '\0')) {
      greatest_info.msg = (char *)0x0;
      iVar2 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x23b;
      greatest_info.msg = "res == TINF_OK && dlen == 1 && out[0] == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00102519;
      iVar2 = -1;
    }
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("zlib_onebyte_dynamic");
  if (iVar2 == 1) {
    _out = CONCAT31(uStack_13b,0xff);
    suffix[0] = '\x01';
    suffix[1] = '\0';
    suffix[2] = '\0';
    suffix[3] = '\0';
    iVar2 = tinf_zlib_uncompress(out,(uint *)suffix,zlib_onebyte_dynamic_data,0x12);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar2 == 0) && (suffix._0_4_ == 1)) && (out[0] == '\0')) {
      greatest_info.msg = (char *)0x0;
      iVar2 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x24d;
      greatest_info.msg = "res == TINF_OK && dlen == 1 && out[0] == 0";
      if ((greatest_info.flags & 4) != 0) goto LAB_00102519;
      iVar2 = -1;
    }
    greatest_test_post(iVar2);
  }
  iVar2 = greatest_test_pre("zlib_zeroes");
  if (iVar2 == 1) {
    _out = 0x100;
    memset(suffix,0xff,0x100);
    iVar2 = tinf_zlib_uncompress(suffix,(uint *)out,zlib_zeroes_data,0xc);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar2 == 0) && (_out == 0x100)) {
      lVar3 = 0;
      do {
        if (lVar3 == 0x100) {
          greatest_info.msg = (char *)0x0;
          iVar2 = 0;
          goto LAB_0010243c;
        }
        pcVar1 = suffix + lVar3;
        lVar3 = lVar3 + 1;
      } while (*pcVar1 == '\0');
      greatest_info.fail_line = 0x266;
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_line = 0x262;
      greatest_info.msg = "res == TINF_OK && dlen == ARRAY_SIZE(out)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
    if ((greatest_info.flags & 4) != 0) {
LAB_00102519:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      abort();
    }
    iVar2 = -1;
LAB_0010243c:
    greatest_test_post(iVar2);
  }
  source = zlib_errors[0].data;
  uVar4 = 0;
  do {
    if (uVar4 == 8) {
      return;
    }
    sprintf(suffix,"%d",uVar4 & 0xffffffff);
    greatest_info.name_suffix = suffix;
    iVar2 = greatest_test_pre("zlib_error_case");
    if (iVar2 == 1) {
      _out = 1;
      iVar2 = tinf_zlib_uncompress
                        (buffer,(uint *)out,source,((packed_data *)(source + -8))->src_size);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (iVar2 == 0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
        greatest_info.fail_line = 0x276;
        greatest_info.msg = "res != TINF_OK";
        iVar2 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00102519;
      }
      else {
        greatest_info.msg = (char *)0x0;
        iVar2 = 0;
      }
      greatest_test_post(iVar2);
    }
    uVar4 = uVar4 + 1;
    source = source + 0x28;
  } while( true );
}

Assistant:

SUITE(tinfzlib)
{
	char suffix[32];
	size_t i;

	RUN_TEST(zlib_empty_raw);
	RUN_TEST(zlib_empty_fixed);
	RUN_TEST(zlib_empty_dynamic);

	RUN_TEST(zlib_onebyte_raw);
	RUN_TEST(zlib_onebyte_fixed);
	RUN_TEST(zlib_onebyte_dynamic);
	RUN_TEST(zlib_zeroes);

	for (i = 0; i < ARRAY_SIZE(zlib_errors); ++i) {
		sprintf(suffix, "%d", (int) i);
		greatest_set_test_suffix(suffix);
		RUN_TEST1(zlib_error_case, &zlib_errors[i]);
	}
}